

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O3

QSize __thiscall QDockWidgetItem::maximumSize(QDockWidgetItem *this)

{
  long *plVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  undefined4 extraout_var_00;
  QDockWidgetLayout *this_00;
  QSize QVar4;
  ulong uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  QSize local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = 0xffffff00000000;
  iVar2 = (*(this->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])();
  uVar5 = 0xffffff;
  if ((QWidget *)CONCAT44(extraout_var,iVar2) != (QWidget *)0x0) {
    QWidget::layout((QWidget *)CONCAT44(extraout_var,iVar2));
    lVar3 = QMetaObject::cast((QObject *)&QDockWidgetLayout::staticMetaObject);
    if ((lVar3 != 0) && (plVar1 = (long *)**(long **)(lVar3 + 0x28), plVar1 != (long *)0x0)) {
      iVar2 = (*(this->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])(this);
      if ((QWidget *)CONCAT44(extraout_var_00,iVar2) == (QWidget *)0x0) {
        this_00 = (QDockWidgetLayout *)0x0;
      }
      else {
        QWidget::layout((QWidget *)CONCAT44(extraout_var_00,iVar2));
        this_00 = (QDockWidgetLayout *)
                  QMetaObject::cast((QObject *)&QDockWidgetLayout::staticMetaObject);
      }
      local_30 = (QSize)(**(code **)(*plVar1 + 0x20))(plVar1);
      QVar4 = QDockWidgetLayout::sizeFromContent(this_00,&local_30,false);
      uVar6 = (ulong)QVar4 & 0xffffffff00000000;
      uVar5 = (ulong)QVar4 & 0xffffffff;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QSize)(uVar5 | uVar6);
  }
  __stack_chk_fail();
}

Assistant:

QSize QDockWidgetItem::maximumSize() const
{
    if (QLayoutItem *item = dockWidgetChildItem()) {
        return dockWidgetLayout()->sizeFromContent(item->maximumSize(), false);
    } else {
        return QSize(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX);
    }
}